

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O1

void __thiscall
presolve::HighsPostsolveStack::duplicateRow
          (HighsPostsolveStack *this,HighsInt row,bool rowUpperTightened,bool rowLowerTightened,
          HighsInt duplicateRow,double duplicateRowScale)

{
  int iVar1;
  int iVar2;
  pointer pcVar3;
  pointer piVar4;
  pointer pcVar5;
  pointer pcVar6;
  size_t position;
  ReductionType local_41;
  double local_40;
  unsigned_long local_38;
  
  pcVar3 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar4 = (this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar4[duplicateRow];
  iVar2 = piVar4[row];
  pcVar5 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_40 = duplicateRowScale;
  std::vector<char,_std::allocator<char>_>::resize
            (&(this->reductionValues).data,(size_type)(pcVar3 + (0x18 - (long)pcVar5)));
  pcVar6 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  *(double *)(pcVar3 + ((long)pcVar6 - (long)pcVar5)) = local_40;
  *(int *)(pcVar3 + (long)(pcVar6 + (8 - (long)pcVar5))) = iVar1;
  *(int *)(pcVar3 + (long)(pcVar6 + (0xc - (long)pcVar5))) = iVar2;
  pcVar3[(long)(pcVar6 + (0x10 - (long)pcVar5))] = rowLowerTightened;
  pcVar3[(long)(pcVar6 + (0x11 - (long)pcVar5))] = rowUpperTightened;
  local_41 = kDuplicateRow;
  local_38 = (long)(this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  std::
  vector<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>,std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>>>
  ::emplace_back<presolve::HighsPostsolveStack::ReductionType&,unsigned_long&>
            ((vector<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>,std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>>>
              *)&this->reductions,&local_41,&local_38);
  return;
}

Assistant:

void duplicateRow(HighsInt row, bool rowUpperTightened,
                    bool rowLowerTightened, HighsInt duplicateRow,
                    double duplicateRowScale) {
    reductionValues.push(
        DuplicateRow{duplicateRowScale, origRowIndex[duplicateRow],
                     origRowIndex[row], rowLowerTightened, rowUpperTightened});
    reductionAdded(ReductionType::kDuplicateRow);
  }